

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_ppm_file_intern(image *this,string *filename,bool bit8)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  int channels;
  istream *piVar3;
  long lVar4;
  FileException *this_00;
  int *piVar5;
  char *msg;
  Exception *pEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar10;
  long local_260;
  ifstream in;
  int aiStack_240 [122];
  undefined1 local_58 [8];
  Ptr image;
  int local_38;
  int local_34;
  int width;
  int height;
  int maxval;
  char temp;
  char signature [2];
  
  std::ifstream::ifstream(&local_260,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_240 + *(long *)(local_260 + -0x18)) != 0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar5 = __errno_location();
    msg = strerror(*piVar5);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read((char *)&local_260,(long)&height + 1);
  if (height._2_1_ == '5' && height._1_1_ == 'P') {
    channels = 1;
  }
  else {
    if ((height._1_1_ != 'P') || (height._2_1_ != '6')) {
      std::ifstream::close();
      pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)local_58,"PPM signature did not match",(allocator *)&local_38);
      util::Exception::Exception(pEVar6,(string *)local_58);
      __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    channels = 3;
  }
  local_38 = 0;
  local_34 = 0;
  width = 0;
  piVar3 = (istream *)std::istream::operator>>((istream *)&local_260,&local_38);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_34);
  std::istream::operator>>(piVar3,&width);
  std::istream::read((char *)&local_260,(long)&height);
  if (0x10000000 < local_34 * local_38) {
    std::ifstream::close();
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)local_58,"Image too friggin huge",(allocator *)((long)&height + 3));
    util::Exception::Exception(pEVar6,(string *)local_58);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (bit8 && width < 0x100) {
    Image<unsigned_char>::create((Image<unsigned_char> *)local_58,local_38,local_34,channels);
    lVar4 = (**(code **)(*(_func_int **)local_58 + 0x28))();
    (**(code **)(*(_func_int **)local_58 + 0x18))();
    std::istream::read((char *)&local_260,lVar4);
    std::__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  else {
    if ((0xffff < width) || (bit8)) {
      std::ifstream::close();
      pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)local_58,"PPM max value is invalid",(allocator *)((long)&height + 3));
      util::Exception::Exception(pEVar6,(string *)local_58);
      __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    Image<unsigned_short>::create((Image<unsigned_short> *)local_58,local_38,local_34,channels);
    lVar4 = (**(code **)(*(_func_int **)local_58 + 0x28))();
    (**(code **)(*(_func_int **)local_58 + 0x18))();
    std::istream::read((char *)&local_260,lVar4);
    p_Var2 = (_func_int *)
             (((ImageData *)((long)local_58 + 0x18))->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (ulong)((long)*(_func_int **)((long)local_58 + 0x20) - (long)p_Var2) >> 1;
    uVar9 = 0;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      p_Var1 = p_Var2 + uVar9 * 2;
      *(ushort *)p_Var1 = *(ushort *)p_Var1 << 8 | *(ushort *)p_Var1 >> 8;
    }
    std::__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image);
  std::ifstream::close();
  std::ifstream::~ifstream(&local_260);
  PVar10.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar10.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar10.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImageBase::Ptr
load_ppm_file_intern (std::string const& filename, bool bit8)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == '5')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == '6')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    int maxval = 0;
    in >> width >> height >> maxval;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    ImageBase::Ptr ret;

    /* Max value should be in <256 for 8 bit and <65535 for 16 bit. */
    if (maxval < 256 && bit8)
    {
        /* Read image content. */
        ByteImage::Ptr image = ByteImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        ret = image;
    }
    else if (maxval < 65536 && !bit8)
    {
        /* Read image content, convert from big-endian to host order. */
        RawImage::Ptr image = RawImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        for (int i = 0; i < image->get_value_amount(); ++i)
            image->at(i) = util::system::betoh(image->at(i));
        ret = image;
    }
    else
    {
        in.close();
        throw util::Exception("PPM max value is invalid");
    }

    in.close();
    return ret;
}